

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

double mpack_expect_double(mpack_reader_t *reader)

{
  anon_union_8_8_6320e492_for_v aVar1;
  undefined1 auVar2 [16];
  mpack_tag_t mVar3;
  
  mVar3 = mpack_read_tag(reader);
  aVar1 = mVar3.v;
  switch(mVar3.type) {
  case mpack_type_int:
    aVar1.d = (double)aVar1.i;
    break;
  case mpack_type_uint:
    auVar2._8_4_ = mVar3.v._4_4_;
    auVar2._0_8_ = aVar1.u;
    auVar2._12_4_ = 0x45300000;
    aVar1.d = (auVar2._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,mVar3.v._0_4_) - 4503599627370496.0);
    break;
  case mpack_type_float:
    aVar1.d = (double)mVar3.v._0_4_;
    break;
  case mpack_type_double:
    break;
  default:
    aVar1.u = 0;
    if (reader->error == mpack_ok) {
      reader->error = mpack_error_type;
      reader->end = reader->data;
      if (reader->error_fn != (mpack_reader_error_t)0x0) {
        (*reader->error_fn)(reader,mpack_error_type);
        aVar1.u = 0;
      }
    }
  }
  return aVar1.d;
}

Assistant:

double mpack_expect_double(mpack_reader_t* reader) {
    mpack_tag_t var = mpack_read_tag(reader);
    if (var.type == mpack_type_uint)
        return (double)var.v.u;
    else if (var.type == mpack_type_int)
        return (double)var.v.i;
    else if (var.type == mpack_type_float)
        return (double)var.v.f;
    else if (var.type == mpack_type_double)
        return var.v.d;
    mpack_reader_flag_error(reader, mpack_error_type);
    return 0.0;
}